

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httphandler.cpp
# Opt level: O0

void __thiscall HttpHandler::GzipFlush(HttpHandler *this)

{
  int local_14;
  int result;
  HttpHandler *this_local;
  
  local_14 = 0;
  while (local_14 == 0) {
    if ((this->zlib).avail_out == 0) {
      std::ostream::write((char *)this->response,(long)(this->buffer + 0x20000));
      (this->zlib).avail_out = 0x20000;
      (this->zlib).next_out = this->buffer + 0x20000;
    }
    local_14 = deflate(&this->zlib,4);
  }
  if (local_14 == 1) {
    std::ostream::write((char *)this->response,(long)(this->buffer + 0x20000));
    deflateEnd(&this->zlib);
    return;
  }
  __assert_fail("result == Z_STREAM_END",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tripplet[P]vbus-server/src/httphandler.cpp"
                ,0xbd,"void HttpHandler::GzipFlush()");
}

Assistant:

void HttpHandler::GzipFlush()
{
    int result = Z_OK;
    while (result == Z_OK)
    {
        if (this->zlib.avail_out == 0)
        {
            this->response.write(reinterpret_cast<const char *>(this->buffer + COMPRESSION_BUFFER_SIZE), COMPRESSION_BUFFER_SIZE);
            this->zlib.avail_out = COMPRESSION_BUFFER_SIZE;
            this->zlib.next_out = this->buffer + COMPRESSION_BUFFER_SIZE;
        }

        result = deflate(&this->zlib, Z_FINISH);
    }

    assert(result == Z_STREAM_END);
    this->response.write(reinterpret_cast<const char *>(this->buffer + COMPRESSION_BUFFER_SIZE), COMPRESSION_BUFFER_SIZE - this->zlib.avail_out);
    deflateEnd(&this->zlib);
}